

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

const_reference __thiscall
google::protobuf::RepeatedField<double>::Get(RepeatedField<double> *this,int index)

{
  int new_size;
  ulong uVar1;
  int iVar2;
  double *pdVar3;
  int *piVar4;
  const_reference pdVar5;
  int *piVar6;
  bool is_soo;
  LongSooRep *this_00;
  bool is_soo_00;
  bool bVar7;
  undefined8 extraout_XMM0_Qa;
  int iStack_64;
  
  this_00 = (LongSooRep *)(ulong)(uint)index;
  if (index < 0) {
    Get();
  }
  else {
    iVar2 = internal::SooRep::size
                      (&this->soo_rep_,
                       (undefined1  [16])
                       ((undefined1  [16])(this->soo_rep_).field_0 & (undefined1  [16])0x4) ==
                       (undefined1  [16])0x0);
    if (index < iVar2) {
      pdVar3 = elements(this,(undefined1  [16])
                             ((undefined1  [16])(this->soo_rep_).field_0 & (undefined1  [16])0x4) ==
                             (undefined1  [16])0x0);
      return pdVar3 + (long)this_00;
    }
  }
  Get();
  uVar1 = this_00->elements_int;
  is_soo_00 = (uVar1 & 4) == 0;
  iVar2 = internal::SooRep::size((SooRep *)this_00,is_soo_00);
  iStack_64 = 1;
  if ((uVar1 & 4) == 0) {
    piVar6 = &this_00->size;
  }
  else {
    iStack_64 = this_00->capacity;
    piVar6 = (int *)internal::LongSooRep::elements(this_00);
  }
  new_size = iVar2 + 1;
  bVar7 = iVar2 == iStack_64;
  if (bVar7) {
    Grow((RepeatedField<double> *)this_00,(uVar1 & 4) == 0,iVar2,new_size);
    iStack_64 = this_00->capacity;
    piVar6 = (int *)internal::LongSooRep::elements(this_00);
  }
  bVar7 = !bVar7;
  is_soo = bVar7 && is_soo_00;
  iVar2 = internal::SooRep::size((SooRep *)this_00,is_soo);
  if ((iVar2 != new_size) && ((this_00->elements_int & 4) != 0)) {
    internal::LongSooRep::elements(this_00);
  }
  set_size((RepeatedField<double> *)this_00,is_soo,new_size);
  *(undefined8 *)(piVar6 + (long)iVar2 * 2) = extraout_XMM0_Qa;
  if (is_soo != ((this_00->elements_int & 4) == 0)) {
    internal::protobuf_assumption_failed
              ("is_soo == final_is_soo",
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/repeated_field.h"
               ,0x35b);
  }
  iVar2 = internal::SooRep::size((SooRep *)this_00,is_soo);
  if (new_size != iVar2) {
    internal::protobuf_assumption_failed
              ("new_size == final_size",
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/repeated_field.h"
               ,0x35d);
  }
  if (bVar7 && is_soo_00) {
    piVar4 = &this_00->size;
  }
  else {
    piVar4 = (int *)internal::LongSooRep::elements(this_00);
  }
  if (piVar6 != piVar4) {
    internal::protobuf_assumption_failed
              ("elem == final_elements",
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/repeated_field.h"
               ,0x35f);
  }
  pdVar5 = (const_reference)0x1;
  if (!bVar7 || !is_soo_00) {
    pdVar5 = (const_reference)(ulong)(uint)this_00->capacity;
  }
  if (iStack_64 != (int)pdVar5) {
    internal::protobuf_assumption_failed
              ("capacity == final_capacity",
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/repeated_field.h"
               ,0x361);
  }
  return pdVar5;
}

Assistant:

inline const Element& RepeatedField<Element>::Get(int index) const
    ABSL_ATTRIBUTE_LIFETIME_BOUND {
  ABSL_DCHECK_GE(index, 0);
  ABSL_DCHECK_LT(index, size());
  return elements(is_soo())[index];
}